

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall
Board::PopulateBoard
          (Board *this,vector<Cord,_std::allocator<Cord>_> *cords,int fromTop,int fromleft)

{
  pointer pCVar1;
  int iVar2;
  int iVar3;
  int i;
  ulong uVar4;
  
  for (uVar4 = 0;
      pCVar1 = (cords->super__Vector_base<Cord,_std::allocator<Cord>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(cords->super__Vector_base<Cord,_std::allocator<Cord>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pCVar1 >> 3);
      uVar4 = uVar4 + 1) {
    iVar3 = pCVar1[uVar4].x + fromTop + 10;
    iVar2 = pCVar1[uVar4].y + fromleft + 10;
    Cell::SetNextState(this->boardWorld[iVar3] + iVar2,FILLED);
    Cell::Increment(this->boardWorld[iVar3] + iVar2);
  }
  return;
}

Assistant:

void Board::PopulateBoard(std::vector<Cord> const & cords, int fromTop, int fromleft)
{
    for(int i = 0; i < cords.size(); i++)
    {
        int x = cords[i].x + MARGIN + fromTop;
        int y = cords[i].y + MARGIN + fromleft;

        boardWorld[x][y].SetNextState(CellState::FILLED);
        boardWorld[x][y].Increment();
    }
}